

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.hpp
# Opt level: O2

bool udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_long>
               (SerializeDirection direction,unsigned_long *value,BufferView *buffer_view)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = true;
  if (direction == kParse) {
    *value = 0;
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + 8) {
      bVar2 = false;
    }
    else {
      for (lVar3 = 0x38; lVar3 != -8; lVar3 = lVar3 + -8) {
        bVar1 = BufferView::Read(buffer_view);
        *value = *value | (ulong)bVar1 << ((byte)lVar3 & 0x3f);
      }
    }
  }
  else if (direction == kSerialize) {
    for (lVar3 = 0x38; lVar3 != -8; lVar3 = lVar3 + -8) {
      BufferView::push_back(buffer_view,(char)(*value >> ((byte)lVar3 & 0x3f)));
    }
  }
  return bVar2;
}

Assistant:

bool SerializeUnsignedIntegerBigEndian(SerializeDirection direction,
                                       ValueType* value,
                                       BufferView* buffer_view) {
  switch (direction) {
    case kSerialize: {
      int n = sizeof(ValueType);
      for (int i = 0; i < n; ++i) {
        uint8_t c = (uint8_t)((*value) >> ((n - i - 1) * 8)) & 0xff;
        buffer_view->push_back(c);
      }
    } break;

    case kParse:
      *value = 0;
      if (buffer_view->CanRead(sizeof(ValueType))) {
        int n = sizeof(ValueType);
        for (int i = 0; i < n; ++i) {
          ValueType v = (uint8_t)buffer_view->Read();
          *value |= (v << ((n - i - 1) * 8));
        }
      } else {
        return false;
      }
      break;
  }

  return true;
}